

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::ToProperty<tinyusdz::value::color3f>
               (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *input,
               Property *output,string *err)

{
  bool bVar1;
  Variability *pVVar2;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  Animatable<tinyusdz::value::color3f> *pAVar3;
  TypedTimeSamples<tinyusdz::value::color3f> *ts_00;
  AttrMeta *pAVar4;
  AttrMeta *this;
  Property local_990;
  int local_3ac;
  undefined1 local_3a8 [8];
  Value val;
  color3f a;
  TimeSamples ts;
  PrimVar pvar;
  Animatable<tinyusdz::value::color3f> v;
  undefined1 local_2d0 [8];
  Attribute attr;
  string *err_local;
  Property *output_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *input_local;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  Attribute::Attribute((Attribute *)local_2d0);
  pVVar2 = Attribute::variability((Attribute *)local_2d0);
  *pVVar2 = Varying;
  tinyusdz::value::TypeTraits<tinyusdz::value::color3f>::type_name_abi_cxx11_();
  Attribute::set_type_name((Attribute *)local_2d0,(string *)&v._ts._dirty);
  ::std::__cxx11::string::~string((string *)&v._ts._dirty);
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::is_blocked
                    (input);
  if (bVar1) {
    bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::is_blocked
                      (input);
    Attribute::set_blocked((Attribute *)local_2d0,bVar1);
  }
  bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
          has_connections(input);
  if (bVar1) {
    paths = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
            get_connections(input);
    Attribute::set_connections((Attribute *)local_2d0,paths);
  }
  pAVar3 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::get_value
                     (input);
  Animatable<tinyusdz::value::color3f>::Animatable
            ((Animatable<tinyusdz::value::color3f> *)&pvar._ts._dirty,pAVar3);
  primvar::PrimVar::PrimVar((PrimVar *)&ts._dirty);
  bVar1 = Animatable<tinyusdz::value::color3f>::has_timesamples
                    ((Animatable<tinyusdz::value::color3f> *)&pvar._ts._dirty);
  if (bVar1) {
    ts_00 = Animatable<tinyusdz::value::color3f>::get_timesamples
                      ((Animatable<tinyusdz::value::color3f> *)&pvar._ts._dirty);
    ToTypelessTimeSamples<tinyusdz::value::color3f>((TimeSamples *)&a.g,ts_00);
    primvar::PrimVar::set_timesamples((PrimVar *)&ts._dirty,(TimeSamples *)&a.g);
    tinyusdz::value::TimeSamples::~TimeSamples((TimeSamples *)&a.g);
  }
  bVar1 = Animatable<tinyusdz::value::color3f>::has_value
                    ((Animatable<tinyusdz::value::color3f> *)&pvar._ts._dirty);
  if (bVar1) {
    bVar1 = Animatable<tinyusdz::value::color3f>::get_scalar
                      ((Animatable<tinyusdz::value::color3f> *)&pvar._ts._dirty,
                       (color3f *)((long)&val.v_.vtable + 4));
    if (!bVar1) {
      if (attr._metas.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)
                   attr._metas.stringData.
                   super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "[InternalError] Invalid Animatable value.");
      }
      input_local._7_1_ = 0;
      local_3ac = 1;
      goto LAB_004b4db6;
    }
    tinyusdz::value::Value::Value<tinyusdz::value::color3f>
              ((Value *)local_3a8,(color3f *)((long)&val.v_.vtable + 4));
    primvar::PrimVar::set_value<tinyusdz::value::Value>((PrimVar *)&ts._dirty,(Value *)local_3a8);
    tinyusdz::value::Value::~Value((Value *)local_3a8);
  }
  Attribute::set_var((Attribute *)local_2d0,(PrimVar *)&ts._dirty);
  local_3ac = 0;
LAB_004b4db6:
  primvar::PrimVar::~PrimVar((PrimVar *)&ts._dirty);
  Animatable<tinyusdz::value::color3f>::~Animatable
            ((Animatable<tinyusdz::value::color3f> *)&pvar._ts._dirty);
  if (local_3ac == 0) {
    pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::metas
                       (input);
    this = Attribute::metas((Attribute *)local_2d0);
    AttrMetas::operator=(this,pAVar4);
    Property::Property(&local_990,(Attribute *)local_2d0,false);
    Property::operator=(output,&local_990);
    Property::~Property(&local_990);
    input_local._7_1_ = 1;
    local_3ac = 1;
  }
  Attribute::~Attribute((Attribute *)local_2d0);
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool ToProperty(const TypedAttributeWithFallback<Animatable<T>> &input,
                Property &output, std::string *err) {
#if 0
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    Property p;
    p.set_property_type(Property::Type::EmptyAttrib);
    p.attribute().set_type_name(value::TypeTraits<T>::type_name());
    p.set_custom(false);
    output = p;
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship rel;
    std::vector<Path> pv = input.get_connections();
    if (pv.empty()) {
      DCOUT("??? Empty connectionTarget.");
      if (err) {
        (*err) += "[InternalError] Empty connectionTarget.";
      }
      return false;
    }
    if (pv.size() == 1) {
      DCOUT("targetPath = " << pv[0]);
      output = Property(pv[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else if (pv.size() > 1) {
      output = Property(pv, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      DCOUT("??? GetConnection faile.");
      if (err) {
        (*err) += "[InternalError] Invalid connectionTarget.";
      }
      return false;
    }

  } else {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;

    if (v.is_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    } else if (v.is_scalar()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    } else {
      DCOUT("??? Invalid Animatable value.");
      if (err) {
        (*err) += "[InternalError] Invalid Animatable value.";
      }
      return false;
    }

    Attribute attr;
    attr.set_var(std::move(pvar));
    attr.variability() = Variability::Varying;
    output = Property(attr, /* custom */ false);
  }
#else

  Attribute attr;
  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections " << input.has_connections());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  {
    // Includes !authored()
    // FIXME: Currently scalar only.
    Animatable<T> v = input.get_value();

    primvar::PrimVar pvar;
    DCOUT("has_timesamples " << v.has_timesamples());
    DCOUT("has_value " << v.has_value());

    if (v.has_timesamples()) {
      value::TimeSamples ts = ToTypelessTimeSamples(v.get_timesamples());
      pvar.set_timesamples(ts);
    }

    if (v.has_value()) {
      T a;
      if (v.get_scalar(&a)) {
        value::Value val(a);
        pvar.set_value(val);
      } else {
        DCOUT("??? Invalid Animatable value.");
        if (err) {
          (*err) += "[InternalError] Invalid Animatable value.";
        }
        return false;
      }
    }

    attr.set_var(std::move(pvar));
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */ false);

#endif

  return true;
}